

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBulkMemory(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  
  if (this->allowMemory == false) {
    pEVar2 = makeTrivial(this,type);
    return pEVar2;
  }
  if (((this->wasm->features).features & 0x10) != 0) {
    if (type.id == 0) {
      uVar1 = Random::upTo(&this->random,4);
      switch(uVar1) {
      case 0:
        pEVar2 = makeMemoryInit(this);
        return pEVar2;
      case 1:
        pEVar2 = makeDataDrop(this);
        return pEVar2;
      case 2:
        pEVar2 = makeMemoryCopy(this);
        return pEVar2;
      case 3:
        pEVar2 = makeMemoryFill(this);
        return pEVar2;
      default:
        wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x125e);
      }
    }
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1253,"Expression *wasm::TranslateToFuzzReader::makeBulkMemory(Type)");
  }
  __assert_fail("wasm.features.hasBulkMemory()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1252,"Expression *wasm::TranslateToFuzzReader::makeBulkMemory(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeBulkMemory(Type type) {
  if (!allowMemory) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasBulkMemory());
  assert(type == Type::none);
  switch (upTo(4)) {
    case 0:
      return makeMemoryInit();
    case 1:
      return makeDataDrop();
    case 2:
      return makeMemoryCopy();
    case 3:
      return makeMemoryFill();
  }
  WASM_UNREACHABLE("invalid value");
}